

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

void __thiscall luna::Table::AppendToArray(Table *this,Value *value)

{
  vector<luna::Value,std::allocator<luna::Value>> *this_00;
  iterator __position;
  ValueT VVar1;
  undefined4 uVar2;
  pointer __p;
  
  if ((this->array_)._M_t.
      super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
      .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
      _M_head_impl == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
    __p = (pointer)operator_new(0x18);
    (__p->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             *)&this->array_,__p);
  }
  this_00 = (vector<luna::Value,std::allocator<luna::Value>> *)
            (this->array_)._M_t.
            super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
            .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
            _M_head_impl;
  __position._M_current = *(Value **)(this_00 + 8);
  if (__position._M_current != *(Value **)(this_00 + 0x10)) {
    VVar1 = value->type_;
    uVar2 = *(undefined4 *)&value->field_0xc;
    (__position._M_current)->field_0 = value->field_0;
    (__position._M_current)->type_ = VVar1;
    *(undefined4 *)&(__position._M_current)->field_0xc = uVar2;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
    return;
  }
  std::vector<luna::Value,std::allocator<luna::Value>>::_M_realloc_insert<luna::Value_const&>
            (this_00,__position,value);
  return;
}

Assistant:

void Table::AppendToArray(const Value &value)
    {
        if (!array_)
            array_.reset(new Array);
        array_->push_back(value);
    }